

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O3

Result_t * __thiscall
Kumu::FileReader::Read
          (Result_t *__return_storage_ptr__,FileReader *this,byte_t *buf,ui32_t buf_len,
          ui32_t *read_count)

{
  ui32_t uVar1;
  ssize_t sVar2;
  ILogSink *this_00;
  undefined1 *rhs;
  
  if (buf == (byte_t *)0x0) {
    this_00 = DefaultLogSink();
    ILogSink::Error(this_00,"NULL pointer in file %s, line %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                    ,0x46f);
    rhs = RESULT_PTR;
  }
  else {
    if (read_count != (ui32_t *)0x0) {
      *read_count = 0;
    }
    if (this->m_Handle == -1) {
      rhs = RESULT_FILEOPEN;
    }
    else {
      sVar2 = read(this->m_Handle,buf,(ulong)buf_len);
      uVar1 = (ui32_t)sVar2;
      if (uVar1 == 0xffffffff) {
        rhs = RESULT_READFAIL;
      }
      else {
        if (read_count != (ui32_t *)0x0) {
          *read_count = uVar1;
        }
        rhs = RESULT_OK;
        if (uVar1 == 0) {
          rhs = RESULT_ENDOFFILE;
        }
      }
    }
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)rhs);
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::FileReader::Read(byte_t* buf, ui32_t buf_len, ui32_t* read_count) const
{
  KM_TEST_NULL_L(buf);
  i32_t  tmp_count = 0;
  ui32_t tmp_int = 0;

  if ( read_count == 0 )
    read_count = &tmp_int;

  *read_count = 0;

  if ( m_Handle == -1L )
    return RESULT_FILEOPEN;

  if ( (tmp_count = read(m_Handle, buf, buf_len)) == -1L )
    return RESULT_READFAIL;

  *read_count = tmp_count;
  return (tmp_count == 0 ? RESULT_ENDOFFILE : RESULT_OK);
}